

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O0

bool __thiscall UnifiedRegex::OctoquadIdentifier::UnionChar(OctoquadIdentifier *this,Char c)

{
  int iVar1;
  int code;
  Char c_local;
  OctoquadIdentifier *this_local;
  
  if (((this->currPatternLength < 8) && (-1 < this->currPatternNum)) && (this->currPatternNum < 2))
  {
    iVar1 = GetOrAddCharCode(this,c);
    if (iVar1 < 0) {
      this_local._7_1_ = false;
    }
    else {
      this->patternBits[this->currPatternNum][this->currPatternLength] =
           this->patternBits[this->currPatternNum][this->currPatternLength] |
           (byte)(1 << ((byte)iVar1 & 0x1f));
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool OctoquadIdentifier::UnionChar(Char c)
    {
        if (currPatternLength >= TrigramInfo::PatternLength || currPatternNum < 0 || currPatternNum >= NumPatterns)
            return false;
        int code = GetOrAddCharCode(c);
        if (code < 0)
            return false;
        patternBits[currPatternNum][currPatternLength] |= 1 << code;
        return true;
    }